

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall
pbrt::RealisticCamera::DrawRayPathFromScene
          (RealisticCamera *this,Ray *r,bool arrow,bool toOpticalIntercept)

{
  uint uVar1;
  undefined8 uVar2;
  size_t sVar3;
  LensElementInterface *pLVar4;
  LensElementInterface *pLVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  int iVar13;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  float fVar39;
  undefined1 auVar40 [16];
  Float t;
  Ray local_e0;
  Point3fi local_b8;
  float vb;
  Float va;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var_01 [56];
  
  sVar3 = (this->elementInterfaces).nStored;
  if (sVar3 == 0) {
    local_98 = ZEXT816(0);
  }
  else {
    fVar26 = 0.0;
    lVar14 = 0;
    do {
      fVar26 = fVar26 + *(float *)((long)&((this->elementInterfaces).ptr)->thickness + lVar14);
      local_98 = ZEXT416((uint)fVar26);
      lVar14 = lVar14 + 0x10;
    } while (sVar3 << 4 != lVar14);
  }
  if ((DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera == '\0') &&
     (iVar13 = __cxa_guard_acquire(&DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera
                                  ), iVar13 != 0)) {
    Scale(&DrawRayPathFromScene::LensFromCamera,1.0,1.0,-1.0);
    __cxa_guard_release(&DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera);
  }
  fVar26 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar20._4_4_ = fVar26;
  auVar20._0_4_ = fVar26;
  auVar20._8_4_ = fVar26;
  auVar20._12_4_ = fVar26;
  fVar26 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar27._4_4_ = fVar26;
  auVar27._0_4_ = fVar26;
  auVar27._8_4_ = fVar26;
  auVar27._12_4_ = fVar26;
  fVar26 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar30._4_4_ = fVar26;
  auVar30._0_4_ = fVar26;
  auVar30._8_4_ = fVar26;
  auVar30._12_4_ = fVar26;
  auVar18 = vmovlhps_avx(auVar20,auVar27);
  local_e0.o.super_Tuple3<pbrt::Point3,_float>.x = auVar18._0_4_;
  local_e0.o.super_Tuple3<pbrt::Point3,_float>.y = auVar18._4_4_;
  local_e0.o.super_Tuple3<pbrt::Point3,_float>.z = auVar18._8_4_;
  local_e0.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar18._12_4_;
  uVar2 = vmovlps_avx(auVar30);
  local_e0.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  local_e0.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)((ulong)uVar2 >> 0x20);
  Transform::operator()(&local_b8,&DrawRayPathFromScene::LensFromCamera,(Point3fi *)&local_e0);
  fVar26 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar39 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar19 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * DrawRayPathFromScene::LensFromCamera.m.m[1][1]))
                            ,ZEXT416((uint)fVar39),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[1][0]));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * DrawRayPathFromScene::LensFromCamera.m.m[0][1]))
                            ,ZEXT416((uint)fVar39),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[0][0]));
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * DrawRayPathFromScene::LensFromCamera.m.m[2][1]))
                            ,ZEXT416((uint)fVar39),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[2][0]));
  auVar30 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar19),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[1][2]));
  auVar18 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar19),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[0][2]));
  auVar20 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar19),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[2][2]));
  auVar28._0_12_ = ZEXT812(0);
  auVar28._12_4_ = 0;
  fVar26 = auVar30._0_4_;
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar26)),auVar18,auVar18);
  auVar27 = vfmadd231ss_fma(auVar27,auVar20,auVar20);
  if (auVar27._0_4_ <= 0.0) {
    auVar21._8_8_ = 0;
    auVar21._0_4_ =
         local_b8.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
    auVar21._4_4_ =
         local_b8.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
  }
  else {
    auVar31._8_4_ = 0x7fffffff;
    auVar31._0_8_ = 0x7fffffff7fffffff;
    auVar31._12_4_ = 0x7fffffff;
    auVar21 = vandps_avx(auVar30,auVar31);
    auVar6 = vandps_avx(auVar18,auVar31);
    auVar31 = vandps_avx(auVar20,auVar31);
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * 0.0)),auVar28,auVar6);
    auVar28 = vfmadd231ss_fma(auVar21,auVar28,auVar31);
    fVar19 = auVar28._0_4_ / auVar27._0_4_;
    fVar39 = auVar18._0_4_ * fVar19;
    local_48 = ZEXT416((uint)(auVar20._0_4_ * fVar19));
    i.high = fVar39;
    i.low = fVar39;
    local_58 = ZEXT416((uint)(fVar26 * fVar19));
    local_88 = auVar20;
    local_78 = auVar30;
    local_68 = auVar18;
    auVar38._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_b8,i);
    auVar38._8_56_ = extraout_var;
    uVar2 = vmovlps_avx(auVar38._0_16_);
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.low = (float)uVar2;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.high = (float)((ulong)uVar2 >> 0x20);
    i_00.high = (float)local_58._0_4_;
    i_00.low = (float)local_58._0_4_;
    auVar25._0_8_ =
         Interval<float>::operator+<float>
                   (&local_b8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar25._8_56_ = extraout_var_00;
    uVar2 = vmovlps_avx(auVar25._0_16_);
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.low = (float)uVar2;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.high = (float)((ulong)uVar2 >> 0x20);
    i_01.high = (float)local_48._0_4_;
    i_01.low = (float)local_48._0_4_;
    auVar24._0_8_ =
         Interval<float>::operator+<float>
                   (&local_b8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar24._8_56_ = extraout_var_01;
    auVar21 = auVar24._0_16_;
    auVar30 = local_78;
    auVar20 = local_88;
    auVar18 = local_68;
  }
  auVar38 = ZEXT1664(auVar20);
  local_e0.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar20._0_4_;
  auVar11._4_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar11._0_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar11._8_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar11._12_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  auVar20 = vhaddps_avx(auVar21,auVar21);
  local_e0.o.super_Tuple3<pbrt::Point3,_float>.z = auVar20._0_4_ * 0.5;
  local_e0.time = r->time;
  local_e0.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(r->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar20 = vinsertps_avx(auVar18,auVar30,0x10);
  auVar27 = vinsertps_avx(auVar11,ZEXT416((uint)local_b8.super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .high),0x10);
  auVar32._0_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar27._0_4_;
  auVar32._4_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar27._4_4_;
  auVar32._8_4_ = auVar27._8_4_ + 0.0;
  auVar32._12_4_ = auVar27._12_4_ + 0.0;
  auVar6._8_4_ = 0x3f000000;
  auVar6._0_8_ = 0x3f0000003f000000;
  auVar6._12_4_ = 0x3f000000;
  auVar17 = vmulps_avx512vl(auVar32,auVar6);
  uVar2 = vmovlps_avx(auVar17);
  local_e0.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar2;
  local_e0.o.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar2 >> 0x20);
  uVar2 = vmovlps_avx(auVar20);
  local_e0.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
  local_e0.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
  if ((this->elementInterfaces).nStored != 0) {
    local_78._0_4_ = (int)CONCAT71(in_register_00000009,toOpticalIntercept);
    local_68._0_4_ = (int)CONCAT71(in_register_00000011,arrow);
    lVar14 = 0;
    uVar16 = 0;
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(local_98,auVar7);
    auVar25 = ZEXT1664(auVar18);
    do {
      pLVar4 = (this->elementInterfaces).ptr;
      local_88 = auVar25._0_16_;
      fVar26 = *(float *)((long)&pLVar4->curvatureRadius + lVar14);
      local_b8.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 0.0;
      local_b8.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = 0.0;
      local_b8.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = 0.0;
      local_98._0_4_ = fVar26;
      if ((fVar26 != 0.0) || (NAN(fVar26))) {
        bVar12 = IntersectSphericalElement
                           (fVar26,auVar25._0_4_ + fVar26,&local_e0,&t,(Normal3f *)&local_b8);
        if (!bVar12) {
          return;
        }
      }
      else {
        auVar8._8_4_ = 0x80000000;
        auVar8._0_8_ = 0x8000000080000000;
        auVar8._12_4_ = 0x80000000;
        auVar18 = vxorps_avx512vl(ZEXT416((uint)(local_e0.o.super_Tuple3<pbrt::Point3,_float>.z -
                                                auVar25._0_4_)),auVar8);
        t = auVar18._0_4_ / auVar38._0_4_;
      }
      vb = 0.0;
      va = t;
      if (t < 0.0) {
        LogFatal<char_const(&)[2],char_const(&)[4],char_const(&)[2],float&,char_const(&)[4],float&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
                   ,0x4a4,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x4fd120,
                   (char (*) [4])"0.f",(char (*) [2])0x4fd120,&va,(char (*) [4])"0.f",&vb);
      }
      printf("Line[{{%f, %f}, {%f, %f}}],",(double)local_e0.o.super_Tuple3<pbrt::Point3,_float>.z,
             (double)local_e0.o.super_Tuple3<pbrt::Point3,_float>.x,
             (double)(local_e0.o.super_Tuple3<pbrt::Point3,_float>.z +
                     t * local_e0.d.super_Tuple3<pbrt::Vector3,_float>.z),
             (double)(local_e0.o.super_Tuple3<pbrt::Point3,_float>.x +
                     t * local_e0.d.super_Tuple3<pbrt::Vector3,_float>.x));
      auVar18._8_8_ = 0;
      auVar18._0_8_ =
           CONCAT44(local_e0.d.super_Tuple3<pbrt::Vector3,_float>.y,
                    local_e0.d.super_Tuple3<pbrt::Vector3,_float>.x);
      auVar27 = ZEXT816(0) << 0x40;
      auVar17._0_4_ =
           local_e0.d.super_Tuple3<pbrt::Vector3,_float>.x * t +
           local_e0.o.super_Tuple3<pbrt::Point3,_float>.x;
      auVar17._4_4_ =
           local_e0.d.super_Tuple3<pbrt::Vector3,_float>.y * t +
           local_e0.o.super_Tuple3<pbrt::Point3,_float>.y;
      auVar17._8_4_ = t * 0.0 + 0.0;
      auVar17._12_4_ = t * 0.0 + 0.0;
      fVar26 = *(float *)((long)&pLVar4->apertureRadius + lVar14);
      auVar29._0_4_ = auVar17._0_4_ * auVar17._0_4_;
      auVar29._4_4_ = auVar17._4_4_ * auVar17._4_4_;
      auVar29._8_4_ = auVar17._8_4_ * auVar17._8_4_;
      auVar29._12_4_ = auVar17._12_4_ * auVar17._12_4_;
      auVar20 = vmovshdup_avx(auVar29);
      auVar20 = vfmadd231ss_fma(auVar20,auVar17,auVar17);
      if (fVar26 * fVar26 < auVar20._0_4_) {
        return;
      }
      local_e0.o.super_Tuple3<pbrt::Point3,_float>.z =
           t * local_e0.d.super_Tuple3<pbrt::Vector3,_float>.z +
           local_e0.o.super_Tuple3<pbrt::Point3,_float>.z;
      uVar2 = vmovlps_avx(auVar17);
      local_e0.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar2;
      local_e0.o.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar2 >> 0x20);
      if (((float)local_98._0_4_ != 0.0) || (NAN((float)local_98._0_4_))) {
        pLVar5 = (this->elementInterfaces).ptr;
        fVar26 = 1.0;
        if (uVar16 != 0) {
          fVar39 = *(float *)((long)pLVar5 + lVar14 + -8);
          if ((fVar39 != 0.0) || (NAN(fVar39))) {
            fVar26 = fVar39;
          }
        }
        uVar1 = *(uint *)((long)&pLVar5->eta + lVar14);
        auVar37._0_4_ =
             local_e0.d.super_Tuple3<pbrt::Vector3,_float>.x *
             local_e0.d.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar37._4_4_ =
             local_e0.d.super_Tuple3<pbrt::Vector3,_float>.y *
             local_e0.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar37._8_8_ = 0;
        auVar20 = vmovshdup_avx(auVar37);
        auVar18 = vfmadd231ss_fma(auVar20,auVar18,auVar18);
        uVar2 = vcmpss_avx512f(ZEXT416(uVar1),auVar27,4);
        bVar12 = (bool)((byte)uVar2 & 1);
        auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)local_e0.d.
                                                        super_Tuple3<pbrt::Vector3,_float>.z),
                                  ZEXT416((uint)local_e0.d.super_Tuple3<pbrt::Vector3,_float>.z));
        fVar26 = (float)(bVar12 * uVar1 + (uint)!bVar12 * 0x3f800000) / fVar26;
        auVar34._0_8_ =
             CONCAT44(local_e0.d.super_Tuple3<pbrt::Vector3,_float>.y,
                      local_e0.d.super_Tuple3<pbrt::Vector3,_float>.x) ^ 0x8000000080000000;
        auVar34._8_4_ = 0x80000000;
        auVar34._12_4_ = 0x80000000;
        auVar22._0_4_ = -local_e0.d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar22._4_4_ = 0x80000000;
        auVar22._8_4_ = 0x80000000;
        auVar22._12_4_ = 0x80000000;
        auVar18 = vsqrtss_avx(auVar18,auVar18);
        fVar39 = auVar18._0_4_;
        auVar33._4_4_ = fVar39;
        auVar33._0_4_ = fVar39;
        auVar33._8_4_ = fVar39;
        auVar33._12_4_ = fVar39;
        auVar23._0_4_ = auVar22._0_4_ / fVar39;
        auVar23._4_12_ = auVar22._4_12_;
        auVar18 = vdivps_avx(auVar34,auVar33);
        auVar35._4_4_ =
             local_b8.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
        auVar35._0_4_ =
             local_b8.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
        auVar35._8_8_ = 0;
        auVar20 = vmovshdup_avx(auVar35);
        auVar30 = vmovshdup_avx(auVar18);
        auVar20 = vfmadd213ss_fma(auVar20,auVar30,
                                  ZEXT416((uint)(local_b8.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.low * auVar23._0_4_)));
        auVar30 = vfmsub231ss_fma(ZEXT416((uint)(local_b8.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.low * auVar23._0_4_)),
                                  ZEXT416((uint)local_b8.super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .low),auVar23);
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ + auVar30._0_4_)),auVar35,auVar18);
        auVar20 = vfnmadd213ss_fma(auVar30,auVar30,SUB6416(ZEXT464(0x3f800000),0));
        auVar20 = vmaxss_avx(auVar20,auVar27);
        fVar39 = auVar20._0_4_ / (fVar26 * fVar26);
        if (1.0 <= fVar39) {
          return;
        }
        auVar20 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar39)),auVar27);
        auVar20 = vsqrtss_avx(auVar20,auVar20);
        fVar39 = auVar30._0_4_ / fVar26 - auVar20._0_4_;
        auVar40._4_4_ = fVar26;
        auVar40._0_4_ = fVar26;
        auVar40._8_4_ = fVar26;
        auVar40._12_4_ = fVar26;
        auVar18 = vdivps_avx(auVar18,auVar40);
        auVar36._0_4_ =
             local_b8.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low * fVar39;
        auVar36._4_4_ =
             local_b8.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high * fVar39;
        auVar36._8_4_ = fVar39 * 0.0;
        auVar36._12_4_ = fVar39 * 0.0;
        local_e0.d.super_Tuple3<pbrt::Vector3,_float>.z =
             local_b8.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low * fVar39 -
             auVar23._0_4_ / fVar26;
        auVar18 = vsubps_avx(auVar36,auVar18);
        uVar2 = vmovlps_avx(auVar18);
        local_e0.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
        local_e0.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
      }
      auVar38 = ZEXT464((uint)local_e0.d.super_Tuple3<pbrt::Vector3,_float>.z);
      uVar16 = uVar16 + 1;
      auVar25 = ZEXT464((uint)((float)local_88._0_4_ + *(float *)((long)&pLVar4->thickness + lVar14)
                              ));
      lVar14 = lVar14 + 0x10;
    } while (uVar16 < (this->elementInterfaces).nStored);
    arrow = local_68[0];
    toOpticalIntercept = local_78[0];
  }
  fVar26 = auVar18._0_4_;
  if (toOpticalIntercept == false) {
    auVar10._8_4_ = 0x80000000;
    auVar10._0_8_ = 0x8000000080000000;
    auVar10._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(ZEXT416((uint)local_e0.o.super_Tuple3<pbrt::Point3,_float>.z),auVar10)
    ;
    fVar39 = auVar18._0_4_ / local_e0.d.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  else {
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(auVar17,auVar9);
    fVar39 = auVar18._0_4_ / fVar26;
    local_98._0_4_ = fVar39;
    printf("Point[{%f, %f}], ",
           (double)(local_e0.o.super_Tuple3<pbrt::Point3,_float>.z +
                   local_e0.d.super_Tuple3<pbrt::Vector3,_float>.z * fVar39),
           (double)(auVar17._0_4_ + fVar26 * fVar39));
    auVar17 = ZEXT416((uint)local_e0.o.super_Tuple3<pbrt::Point3,_float>.x);
    fVar39 = (float)local_98._0_4_;
    fVar26 = local_e0.d.super_Tuple3<pbrt::Vector3,_float>.x;
  }
  pcVar15 = "Line";
  if (arrow != false) {
    pcVar15 = "Arrow";
  }
  printf("%s[{{%f, %f}, {%f, %f}}]",(double)local_e0.o.super_Tuple3<pbrt::Point3,_float>.z,
         (double)auVar17._0_4_,
         (double)(local_e0.o.super_Tuple3<pbrt::Point3,_float>.z +
                 fVar39 * local_e0.d.super_Tuple3<pbrt::Vector3,_float>.z),
         (double)(auVar17._0_4_ + fVar26 * fVar39),pcVar15);
  return;
}

Assistant:

void RealisticCamera::DrawRayPathFromScene(const Ray &r, bool arrow,
                                           bool toOpticalIntercept) const {
    Float elementZ = LensFrontZ() * -1;

    // Transform _ray_ from camera to lens system space
    static const Transform LensFromCamera = Scale(1, 1, -1);
    Ray ray = LensFromCamera(r);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        bool isStop = (element.curvatureRadius == 0);
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        if (isStop)
            t = -(ray.o.z - elementZ) / ray.d.z;
        else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, ray, &t, &n))
                return;
        }
        CHECK_GE(t, 0.f);

        printf("Line[{{%f, %f}, {%f, %f}}],", ray.o.z, ray.o.x, ray(t).z, ray(t).x);

        // Test intersection point against element aperture
        Point3f pHit = ray(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        Float apertureRadius2 = element.apertureRadius * element.apertureRadius;
        if (r2 > apertureRadius2)
            return;
        ray.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0.f)
                              ? 1.f
                              : elementInterfaces[i - 1].eta;
            Float eta_t =
                (elementInterfaces[i].eta != 0.f) ? elementInterfaces[i].eta : 1.f;
            if (!Refract(Normalize(-ray.d), n, eta_t / eta_i, &wt))
                return;
            ray.d = wt;
        }
        elementZ += element.thickness;
    }

    // go to the film plane by default
    {
        Float ta = -ray.o.z / ray.d.z;
        if (toOpticalIntercept) {
            ta = -ray.o.x / ray.d.x;
            printf("Point[{%f, %f}], ", ray(ta).z, ray(ta).x);
        }
        printf("%s[{{%f, %f}, {%f, %f}}]", arrow ? "Arrow" : "Line", ray.o.z, ray.o.x,
               ray(ta).z, ray(ta).x);
    }
}